

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O2

void nn_aws_term(nn_aws *self)

{
  if (self->state == 1) {
    nn_list_item_term(&self->item);
    nn_fsm_event_term(&self->done);
    nn_fsm_event_term(&self->accepted);
    nn_sws_term(&self->sws);
    nn_usock_term(&self->usock);
    nn_fsm_term(&self->fsm);
    return;
  }
  fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
          "NN_AWS_STATE_IDLE",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
          ,0x46);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_aws_term (struct nn_aws *self)
{
    nn_assert_state (self, NN_AWS_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_sws_term (&self->sws);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}